

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_socket.c
# Opt level: O0

void accept_callback(void *context,cio_epoll_error error)

{
  code *pcVar1;
  undefined8 uVar2;
  int client_fd_00;
  cio_error cVar3;
  int *piVar4;
  cio_socket *socket;
  cio_error err_1;
  cio_socket *client_socket;
  socklen_t local_ac;
  int client_fd;
  socklen_t addrlen;
  sockaddr_storage addr;
  int fd;
  cio_error err;
  cio_server_socket *server_socket;
  cio_epoll_error error_local;
  void *context_local;
  
  if (error == CIO_EPOLL_SUCCESS) {
    addr.__ss_align._0_4_ = *(int *)((long)context + 0x20);
    memset(&client_fd,0,0x80);
    local_ac = 0x80;
    client_fd_00 = accept4((int)addr.__ss_align,(sockaddr *)&client_fd,&local_ac,0x80800);
    if (client_fd_00 == -1) {
      piVar4 = __errno_location();
      if ((*piVar4 != 0xb) && (piVar4 = __errno_location(), *piVar4 != 9)) {
        pcVar1 = *(code **)((long)context + 0x40);
        uVar2 = *(undefined8 *)((long)context + 0x48);
        piVar4 = __errno_location();
        (*pcVar1)(context,uVar2,-*piVar4,0);
      }
    }
    else {
      socket = (cio_socket *)(**(code **)((long)context + 0x50))();
      if (socket == (cio_socket *)0x0) {
        (**(code **)((long)context + 0x40))
                  (context,*(undefined8 *)((long)context + 0x48),0xfffffff4,0);
        close(client_fd_00);
      }
      else {
        cVar3 = cio_linux_socket_init
                          (socket,client_fd_00,*(cio_eventloop **)((long)context + 0x28),*context,
                           *(cio_socket_close_hook_t *)((long)context + 0x58));
        if (cVar3 == CIO_SUCCESS) {
          (**(code **)((long)context + 0x40))
                    (context,*(undefined8 *)((long)context + 0x48),0,socket);
        }
        else {
          (**(code **)((long)context + 0x40))(context,*(undefined8 *)((long)context + 0x48),cVar3,0)
          ;
          close(client_fd_00);
          (**(code **)((long)context + 0x58))(socket);
        }
      }
    }
  }
  else {
    addr.__ss_align._4_4_ = cio_linux_get_socket_error(*(int *)((long)context + 0x20));
    (**(code **)((long)context + 0x40))
              (context,*(undefined8 *)((long)context + 0x48),addr.__ss_align._4_4_,0);
  }
  return;
}

Assistant:

static void accept_callback(void *context, enum cio_epoll_error error)
{
	struct cio_server_socket *server_socket = context;

	if (cio_unlikely(error != CIO_EPOLL_SUCCESS)) {
		enum cio_error err = cio_linux_get_socket_error(server_socket->impl.ev.fd);
		server_socket->handler(server_socket, server_socket->handler_context, err, NULL);
		return;
	}

	int fd = server_socket->impl.ev.fd;

	struct sockaddr_storage addr;
	memset(&addr, 0, sizeof(addr));
	socklen_t addrlen = sizeof(addr);

	int client_fd = accept4(fd, (struct sockaddr *)&addr, &addrlen, (unsigned int)SOCK_NONBLOCK | (unsigned int)SOCK_CLOEXEC);
	if (cio_unlikely(client_fd == -1)) {
		if ((errno != EAGAIN) && (errno != EBADF)) {
			server_socket->handler(server_socket, server_socket->handler_context, (enum cio_error)(-errno), NULL);
		}
	} else {
		struct cio_socket *client_socket = server_socket->alloc_client();
		if (cio_unlikely(client_socket == NULL)) {
			server_socket->handler(server_socket, server_socket->handler_context, CIO_NO_MEMORY, client_socket);
			close(client_fd);
			return;
		}

		enum cio_error err = cio_linux_socket_init(client_socket, client_fd, server_socket->impl.loop, server_socket->impl.close_timeout_ns, server_socket->free_client);
		if (cio_likely(err == CIO_SUCCESS)) {
			server_socket->handler(server_socket, server_socket->handler_context, err, client_socket);
		} else {
			server_socket->handler(server_socket, server_socket->handler_context, err, NULL);
			close(client_fd);
			server_socket->free_client(client_socket);
		}
	}
}